

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

pair<slang::ast::Compilation::DefinitionLookupResult,_bool> * __thiscall
slang::ast::Compilation::resolveConfigRules
          (pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *__return_storage_ptr__,
          Compilation *this,string_view lookupName,Scope *scope,ResolvedConfig *parentConfig,
          ConfigRule *rule,
          vector<slang::ast::Symbol_*,_std::allocator<slang::ast::Symbol_*>_> *defList)

{
  group_type_pointer pgVar1;
  ConfigBlockSymbol *this_00;
  ulong uVar2;
  uint uVar3;
  size_t __n;
  int iVar4;
  DefinitionSymbol *pDVar5;
  uint64_t uVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  value_type_pointer ppVar10;
  ulong uVar11;
  group_type_pointer pgVar12;
  size_t sVar13;
  pointer ppSVar14;
  value_type_pointer ppVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  CellOverride *cellOverride;
  optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> result;
  anon_class_40_5_c3c3317d findDefWithOverride;
  ulong local_110;
  CellOverride *local_f0;
  ulong local_e8;
  long local_e0;
  value_type_pointer local_d8;
  group_type_pointer local_d0;
  ulong local_c8;
  pair<slang::ast::Compilation::DefinitionLookupResult,_bool> *local_c0;
  char *local_b8;
  ulong local_b0;
  basic_string_view<char,_std::char_traits<char>_> local_a8;
  _Storage<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>,_true> local_98;
  char local_78;
  anon_class_40_5_c3c3317d local_70;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  uchar uStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  uchar uStack_39;
  
  local_a8._M_str = lookupName._M_str;
  local_a8._M_len = lookupName._M_len;
  local_f0 = (CellOverride *)0x0;
  ppSVar14 = (pointer)0x0;
  sVar13 = 0;
  if (parentConfig != (ResolvedConfig *)0x0) {
    this_00 = parentConfig->useConfig;
    ppSVar14 = (parentConfig->liblist)._M_ptr;
    sVar13 = (parentConfig->liblist)._M_extent._M_extent_value;
    if (this_00->resolved == false) {
      ConfigBlockSymbol::resolve(this_00);
    }
    uVar6 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                      ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                       &this_00->cellOverrides,&local_a8);
    __n = local_a8._M_len;
    uVar11 = uVar6 >> ((byte)(this_00->cellOverrides).table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                             .arrays.groups_size_index & 0x3f);
    pgVar12 = (this_00->cellOverrides).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
              .arrays.groups_;
    lVar9 = (uVar6 & 0xff) * 4;
    uVar18 = (&UNK_009584ac)[lVar9];
    uVar19 = (&UNK_009584ad)[lVar9];
    uVar20 = (&UNK_009584ae)[lVar9];
    uVar21 = (&UNK_009584af)[lVar9];
    local_b8 = local_a8._M_str;
    uVar8 = (ulong)((uint)uVar6 & 7);
    local_110 = 0;
    uVar22 = uVar18;
    uVar23 = uVar19;
    uVar24 = uVar20;
    uVar25 = uVar21;
    uVar26 = uVar18;
    uVar27 = uVar19;
    uVar28 = uVar20;
    uVar29 = uVar21;
    uVar30 = uVar18;
    uVar31 = uVar19;
    uVar32 = uVar20;
    uVar33 = uVar21;
    do {
      local_e0 = uVar11 * 0x10;
      pgVar1 = pgVar12 + uVar11;
      auVar17[0] = -(pgVar1->m[0].n == uVar18);
      auVar17[1] = -(pgVar1->m[1].n == uVar19);
      auVar17[2] = -(pgVar1->m[2].n == uVar20);
      auVar17[3] = -(pgVar1->m[3].n == uVar21);
      auVar17[4] = -(pgVar1->m[4].n == uVar22);
      auVar17[5] = -(pgVar1->m[5].n == uVar23);
      auVar17[6] = -(pgVar1->m[6].n == uVar24);
      auVar17[7] = -(pgVar1->m[7].n == uVar25);
      auVar17[8] = -(pgVar1->m[8].n == uVar26);
      auVar17[9] = -(pgVar1->m[9].n == uVar27);
      auVar17[10] = -(pgVar1->m[10].n == uVar28);
      auVar17[0xb] = -(pgVar1->m[0xb].n == uVar29);
      auVar17[0xc] = -(pgVar1->m[0xc].n == uVar30);
      auVar17[0xd] = -(pgVar1->m[0xd].n == uVar31);
      auVar17[0xe] = -(pgVar1->m[0xe].n == uVar32);
      auVar17[0xf] = -(pgVar1->m[0xf].n == uVar33);
      uVar7 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                             (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                             (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                             (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                             (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                             (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                             (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                             (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                             (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                             (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                             (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                             (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                             (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                             (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
      if (uVar7 != 0) {
        ppVar15 = (this_00->cellOverrides).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
                  .arrays.elements_ + uVar11 * 0xf;
        local_e8 = uVar8;
        local_d8 = ppVar15;
        local_d0 = pgVar12;
        local_c8 = uVar11;
        local_c0 = __return_storage_ptr__;
        local_48 = uVar18;
        uStack_47 = uVar19;
        uStack_46 = uVar20;
        uStack_45 = uVar21;
        uStack_44 = uVar22;
        uStack_43 = uVar23;
        uStack_42 = uVar24;
        uStack_41 = uVar25;
        uStack_40 = uVar26;
        uStack_3f = uVar27;
        uStack_3e = uVar28;
        uStack_3d = uVar29;
        uStack_3c = uVar30;
        uStack_3b = uVar31;
        uStack_3a = uVar32;
        uStack_39 = uVar33;
        do {
          uVar3 = 0;
          if (uVar7 != 0) {
            for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
            }
          }
          ppVar10 = ppVar15 + uVar3;
          bVar16 = __n == (ppVar10->first)._M_len;
          uVar8 = (ulong)uVar7;
          if (bVar16 && __n != 0) {
            local_b0 = (ulong)uVar7;
            iVar4 = bcmp(local_b8,(ppVar10->first)._M_str,__n);
            bVar16 = iVar4 == 0;
            __return_storage_ptr__ = local_c0;
            uVar11 = local_c8;
            pgVar12 = local_d0;
            uVar8 = local_b0;
            ppVar15 = local_d8;
            uVar18 = local_48;
            uVar19 = uStack_47;
            uVar20 = uStack_46;
            uVar21 = uStack_45;
            uVar22 = uStack_44;
            uVar23 = uStack_43;
            uVar24 = uStack_42;
            uVar25 = uStack_41;
            uVar26 = uStack_40;
            uVar27 = uStack_3f;
            uVar28 = uStack_3e;
            uVar29 = uStack_3d;
            uVar30 = uStack_3c;
            uVar31 = uStack_3b;
            uVar32 = uStack_3a;
            uVar33 = uStack_39;
          }
          if (bVar16) goto LAB_0083813f;
          uVar7 = (uint)uVar8 - 1 & (uint)uVar8;
          uVar8 = local_e8;
        } while (uVar7 != 0);
      }
      if ((pgVar12->m[local_e0 + 0xf].n &
          (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            is_not_overflowed(unsigned_long)::shift)[uVar8]) == 0) break;
      uVar2 = (this_00->cellOverrides).table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::CellOverride>_>_>
              .arrays.groups_size_mask;
      lVar9 = uVar11 + local_110;
      local_110 = local_110 + 1;
      uVar11 = lVar9 + 1U & uVar2;
    } while (local_110 <= uVar2);
    ppVar10 = (value_type_pointer)0x0;
LAB_0083813f:
    if (ppVar10 != (value_type_pointer)0x0) {
      local_f0 = &ppVar10->second;
      rule = (ppVar10->second).defaultRule;
    }
  }
  if (rule != (ConfigRule *)0x0) {
    if ((rule->useCell).name._M_len != 0) {
      resolveConfigRule(__return_storage_ptr__,this,scope,rule);
      return __return_storage_ptr__;
    }
    rule->isUsed = true;
    if ((rule->liblist).
        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
        ._M_payload.
        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
        ._M_engaged == true) {
      ppSVar14 = (rule->liblist).
                 super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                 ._M_payload.
                 super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                 ._M_payload._M_value._M_ptr;
      sVar13 = *(size_t *)
                ((long)&(rule->liblist).
                        super__Optional_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>,_true,_true>
                        ._M_payload.
                        super__Optional_payload_base<std::span<const_slang::SourceLibrary_*const,_18446744073709551615UL>_>
                        ._M_payload + 8);
    }
  }
  local_70.cellOverride = &local_f0;
  local_70.defList = defList;
  local_70.rule = &rule;
  local_70.this = this;
  local_70.scope = scope;
  if (sVar13 == 0) {
    pDVar5 = Symbol::getDeclaringDefinition(scope->thisSym);
    if ((pDVar5 != (DefinitionSymbol *)0x0) &&
       (resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                  ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> *)
                   &local_98._M_value,&local_70,pDVar5->sourceLibrary), local_78 == '\x01')) {
LAB_00837f32:
      (__return_storage_ptr__->first).configRule = local_98._M_value.first.configRule;
      *(undefined8 *)&__return_storage_ptr__->second = local_98._24_8_;
      goto LAB_00837f54;
    }
  }
  else {
    lVar9 = 0;
    do {
      resolveConfigRules::anon_class_40_5_c3c3317d::operator()
                ((optional<std::pair<slang::ast::Compilation::DefinitionLookupResult,_bool>_> *)
                 &local_98._M_value,&local_70,*(SourceLibrary **)((long)ppSVar14 + lVar9));
      if (local_78 == '\x01') goto LAB_00837f32;
      lVar9 = lVar9 + 8;
    } while (sVar13 * 8 != lVar9);
  }
  local_98._M_value.first.definition = (Symbol *)0x0;
  local_98._M_value.first.configRoot = (ConfigBlockSymbol *)0x0;
  *(undefined1 (*) [16])((long)&(__return_storage_ptr__->first).configRoot + 1) =
       (undefined1  [16])0x0;
LAB_00837f54:
  (__return_storage_ptr__->first).definition = local_98._M_value.first.definition;
  (__return_storage_ptr__->first).configRoot = local_98._M_value.first.configRoot;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Compilation::DefinitionLookupResult, bool> Compilation::resolveConfigRules(
    std::string_view lookupName, const Scope& scope, const ResolvedConfig* parentConfig,
    const ConfigRule* rule, const std::vector<Symbol*>& defList) const {

    const ConfigBlockSymbol::CellOverride* cellOverride = nullptr;
    std::span<const SourceLibrary* const> liblist;
    if (parentConfig) {
        SLANG_ASSERT(!rule);
        liblist = parentConfig->liblist;

        auto& conf = parentConfig->useConfig;
        auto& overrides = conf.getCellOverrides();
        if (auto overrideIt = overrides.find(lookupName); overrideIt != overrides.end()) {
            cellOverride = &overrideIt->second;
            rule = cellOverride->defaultRule;
        }
    }

    if (rule) {
        if (auto& id = rule->useCell; !id.name.empty())
            return resolveConfigRule(scope, *rule);

        rule->isUsed = true;
        if (rule->liblist)
            liblist = *rule->liblist;
    }

    auto findDefWithOverride = [&](const SourceLibrary& targetLib)
        -> std::optional<std::pair<Compilation::DefinitionLookupResult, bool>> {
        // If we have a cell override that specifically targets
        // this lib then we should just return that directly.
        if (cellOverride) {
            if (auto it = cellOverride->specificLibRules.find(&targetLib);
                it != cellOverride->specificLibRules.end()) {
                return resolveConfigRule(scope, *it->second);
            }
        }

        // Otherwise try to find the def in our list.
        if (auto def = findDefByLib(defList, targetLib)) {
            return std::pair<Compilation::DefinitionLookupResult, bool>{{def, nullptr, rule},
                                                                        false};
        }
        return std::nullopt;
    };

    if (!liblist.empty()) {
        // This search is O(n^2) but both lists should be small
        // (or even just one element each) in basically all cases.
        for (auto lib : liblist) {
            if (auto result = findDefWithOverride(*lib))
                return *result;
        }
    }
    else if (auto parentDef = scope.asSymbol().getDeclaringDefinition()) {
        // Fall back to picking based on the parent instance's library.
        if (auto result = findDefWithOverride(parentDef->sourceLibrary))
            return *result;
    }

    return {{}, false};
}